

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

uint megumax::select_best_child_index(UCTNode *node)

{
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *pvVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  size_t idx;
  double dVar5;
  double dVar6;
  
  pvVar1 = UCTNode::children(node);
  uVar3 = 0;
  if (1 < (ulong)(((long)(pvVar1->
                         super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar1->
                         super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3)) {
    uVar3 = 0;
    idx = 1;
    uVar4 = 2;
    do {
      dVar5 = UCTNode::child_score(node,idx);
      dVar6 = UCTNode::child_score(node,(ulong)uVar3);
      if (dVar6 < dVar5) {
        uVar3 = uVar4 - 1;
      }
      idx = (size_t)uVar4;
      pvVar1 = UCTNode::children(node);
      uVar2 = ((long)(pvVar1->
                     super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar1->
                     super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      uVar4 = uVar4 + 1;
    } while (idx <= uVar2 && uVar2 - idx != 0);
  }
  return uVar3;
}

Assistant:

unsigned select_best_child_index(const UCTNode* node) {
    unsigned best_node_index = 0;
    for (unsigned i = 1; i < node->children().size(); ++i) {
        if (node->child_score(i) > node->child_score(best_node_index)) {
            best_node_index = i;
        }
    }
    return best_node_index;
}